

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferViewTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  VkDevice device;
  DeviceInterface *vk;
  InstanceInterface *pIVar5;
  VkPhysicalDevice pVVar6;
  ostream *poVar7;
  NotSupportedError *this_00;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_328;
  string local_308;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  Move<vk::Handle<(vk::HandleType)12>_> bufferView;
  Move<vk::Handle<(vk::HandleType)8>_> testBuffer;
  VkMemoryAllocateInfo memAlloc;
  deUint32 queueFamilyIndex;
  VkMemoryRequirements memReqs;
  VkFormatProperties properties;
  VkBufferCreateInfo bufferParams;
  ostringstream errorMsg;
  undefined4 uStack_1a4;
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  bufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.pNext = (void *)0x0;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  bufferParams.flags = 0;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  bufferParams.size = 0x1a40;
  bufferParams.usage = (this->m_testCase).usage;
  bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferParams.queueFamilyIndexCount = 1;
  pIVar5 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar5->_vptr_InstanceInterface[3])(pIVar5,pVVar6,(ulong)(this->m_testCase).format,&properties);
  if ((properties.bufferFeatures & (this->m_testCase).features) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferViewCreateTests.cpp"
               ,0x75);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_308,vk,device,&bufferParams,
                     (VkAllocationCallbacks *)0x0);
  uVar3 = local_308.field_2._8_8_;
  uVar2 = local_308.field_2._M_allocated_capacity;
  sVar1 = local_308._M_string_length;
  _errorMsg = local_308._M_dataplus._M_p;
  local_308._M_dataplus._M_p = (pointer)0x0;
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  local_308.field_2._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)uVar2
  ;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)uVar3;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       (deUint64)_errorMsg;
  testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)sVar1;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_308);
  (*vk->_vptr_DeviceInterface[0xe])
            (vk,device,
             testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             &memReqs);
  if (memReqs.size < 0x1a40) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
    poVar7 = std::operator<<((ostream *)&errorMsg,"Requied memory size (");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," bytes) smaller than the buffer\'s size (");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7," bytes)!");
    std::__cxx11::stringbuf::str();
    tcu::TestStatus::fail(__return_storage_ptr__,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
  }
  else {
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    memAlloc.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    memAlloc.pNext = (void *)0x0;
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    memAlloc.allocationSize = memReqs.size;
    if (memReqs.memoryTypeBits == 0) {
      memAlloc.memoryTypeIndex = 0x20;
    }
    else {
      memAlloc.memoryTypeIndex = 0;
      if (memReqs.memoryTypeBits != 0) {
        for (; (memReqs.memoryTypeBits >> memAlloc.memoryTypeIndex & 1) == 0;
            memAlloc.memoryTypeIndex = memAlloc.memoryTypeIndex + 1) {
        }
      }
    }
    _errorMsg = 0xd;
    bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    ::vk::allocateMemory
              ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_328,vk,device,&memAlloc,
               (VkAllocationCallbacks *)0x0);
    local_308.field_2._M_allocated_capacity = (size_type)local_328.m_data.deleter.m_device;
    local_308.field_2._8_8_ = local_328.m_data.deleter.m_allocator;
    local_308._M_dataplus._M_p = (pointer)local_328.m_data.object.m_internal;
    local_308._M_string_length = (size_type)local_328.m_data.deleter.m_deviceIface;
    local_328.m_data.object.m_internal = 0;
    local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_328.m_data.deleter.m_device = (VkDevice)0x0;
    local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
              (&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
         (VkDevice)local_308.field_2._M_allocated_capacity;
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_308.field_2._8_8_;
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
         (deUint64)local_308._M_dataplus._M_p;
    memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_308._M_string_length;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_328);
    iVar4 = (*vk->_vptr_DeviceInterface[0xc])
                      (vk,device,
                       testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                       m_internal,
                       memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
                      );
    if (iVar4 == 0) {
      ::vk::createBufferView
                ((Move<vk::Handle<(vk::HandleType)12>_> *)&local_328,vk,device,
                 (VkBufferViewCreateInfo *)&errorMsg,(VkAllocationCallbacks *)0x0);
      local_308.field_2._M_allocated_capacity = (size_type)local_328.m_data.deleter.m_device;
      local_308.field_2._8_8_ = local_328.m_data.deleter.m_allocator;
      local_308._M_dataplus._M_p = (pointer)local_328.m_data.object.m_internal;
      local_308._M_string_length = (size_type)local_328.m_data.deleter.m_deviceIface;
      local_328.m_data.object.m_internal = 0;
      local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_328.m_data.deleter.m_device = (VkDevice)0x0;
      local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::reset
                (&bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>);
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)local_308.field_2._M_allocated_capacity;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)local_308.field_2._8_8_;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
           (deUint64)local_308._M_dataplus._M_p;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)local_308._M_string_length;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)12>_> *)&local_328);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
                (&bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>);
      _errorMsg = 0xd;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      ::vk::createBufferView
                ((Move<vk::Handle<(vk::HandleType)12>_> *)&local_328,vk,device,
                 (VkBufferViewCreateInfo *)&errorMsg,(VkAllocationCallbacks *)0x0);
      local_308.field_2._M_allocated_capacity = (size_type)local_328.m_data.deleter.m_device;
      local_308.field_2._8_8_ = local_328.m_data.deleter.m_allocator;
      local_308._M_dataplus._M_p = (pointer)local_328.m_data.object.m_internal;
      local_308._M_string_length = (size_type)local_328.m_data.deleter.m_deviceIface;
      local_328.m_data.object.m_internal = 0;
      local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_328.m_data.deleter.m_device = (VkDevice)0x0;
      local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::reset
                (&bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>);
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)local_308.field_2._M_allocated_capacity;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)local_308.field_2._8_8_;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
           (deUint64)local_308._M_dataplus._M_p;
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)local_308._M_string_length;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)12>_> *)&local_328);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
                (&bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorMsg,"BufferView test",(allocator<char> *)&local_308);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&errorMsg);
      std::__cxx11::string::~string((string *)&errorMsg);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"Bind buffer memory failed!",(allocator<char> *)&local_328);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
                (&bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>);
    }
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
              (&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&testBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferViewTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const VkSemaphore*)DE_NULL,
		(const VkPipelineStageFlags*)DE_NULL,
		1u,
		&m_cmdBuffer.get(),
		0u,
		(const VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	tcu::TestStatus				testStatus	= checkResult();
	if (testStatus.getCode() != QP_TEST_RESULT_PASS)
	{
		return testStatus;
	}

	// Generate and bind another buffer
	std::vector<deUint32>		uniformData;
	const VkDeviceSize			uniformSize = m_testCase.bufferSize * sizeof(deUint32);
	const deInt8				factor		= 2;

	generateBuffer(uniformData, m_testCase.bufferSize, factor);
	deMemcpy(m_uniformBufferAlloc->getHostPtr(), uniformData.data(), (size_t)uniformSize);

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return checkResult(factor);
}